

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

ElementObserverListBackInserter * __thiscall
Rml::ElementObserverListBackInserter::operator=
          (ElementObserverListBackInserter *this,Element *element)

{
  vector<Rml::ObserverPtr<Rml::Element>,std::allocator<Rml::ObserverPtr<Rml::Element>>> *this_00;
  int iVar1;
  ObserverPtr<Rml::Element> local_20;
  
  this_00 = (vector<Rml::ObserverPtr<Rml::Element>,std::allocator<Rml::ObserverPtr<Rml::Element>>> *
            )this->elements;
  local_20.block = (element->super_EnableObserverPtr<Rml::Element>).block;
  if (local_20.block == (ObserverPtrBlock *)0x0) {
    local_20.block = Detail::AllocateObserverPtrBlock();
    (element->super_EnableObserverPtr<Rml::Element>).block = local_20.block;
    (local_20.block)->num_observers = 0;
    (local_20.block)->pointed_to_object = element;
    iVar1 = 1;
  }
  else {
    iVar1 = (local_20.block)->num_observers + 1;
  }
  (local_20.block)->num_observers = iVar1;
  ::std::vector<Rml::ObserverPtr<Rml::Element>,std::allocator<Rml::ObserverPtr<Rml::Element>>>::
  emplace_back<Rml::ObserverPtr<Rml::Element>>(this_00,&local_20);
  ObserverPtr<Rml::Element>::reset(&local_20);
  return this;
}

Assistant:

ElementObserverListBackInserter& operator=(Element* element)
	{
		elements->push_back(element->GetObserverPtr());
		return *this;
	}